

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O1

void __thiscall mjs::regexp::regexp(regexp *this,wstring_view pattern,regexp_flag flags)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Head_base<0UL,_mjs::regexp::impl_*,_false> _Var2;
  wchar_t *__first;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> local_50;
  
  __first = pattern._M_str;
  _Var2._M_head_impl = (impl *)operator_new(0x20);
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<wchar_t_const*>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_50,__first,
             __first + pattern._M_len,0x11 - ((flags & ignore_case) == none));
  ((_Var2._M_head_impl)->r_)._M_flags = local_50._M_flags;
  std::locale::locale((locale *)((long)&(_Var2._M_head_impl)->r_ + 8),&local_50._M_loc);
  _Var1._M_pi = local_50._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  (((_AutomatonPtr *)((long)&(_Var2._M_head_impl)->r_ + 0x10))->
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = local_50._M_automaton.
             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->r_ + 0x18))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->r_ + 0x18))->_M_pi =
       _Var1._M_pi;
  local_50._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->impl_)._M_t.
  super___uniq_ptr_impl<mjs::regexp::impl,_std::default_delete<mjs::regexp::impl>_>._M_t.
  super__Tuple_impl<0UL,_mjs::regexp::impl_*,_std::default_delete<mjs::regexp::impl>_>.
  super__Head_base<0UL,_mjs::regexp::impl_*,_false>._M_head_impl = _Var2._M_head_impl;
  std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex(&local_50);
  (this->pattern_)._M_dataplus._M_p = (pointer)&(this->pattern_).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&this->pattern_,__first,__first + pattern._M_len);
  this->flags_ = flags;
  return;
}

Assistant:

regexp::regexp(std::wstring_view pattern, regexp_flag flags)
    : impl_{new impl{make_regex(pattern, flags)}}
    , pattern_{pattern}
    , flags_{flags} {
}